

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# livevar_analyse.hpp
# Opt level: O1

void __thiscall optimization::livevar_analyse::Livevar_Analyse::roll_phi(Livevar_Analyse *this)

{
  int iVar1;
  size_type sVar2;
  iterator __position;
  _Base_ptr p_Var3;
  _Rb_tree_header *p_Var4;
  
  p_Var3 = (this->func->basic_blks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var4 = &(this->func->basic_blks)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var3 != p_Var4) {
    do {
      __position._M_current =
           (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)p_Var3[3]._M_parent
      ;
      if ((_Base_ptr)__position._M_current != p_Var3[3]._M_left) {
        do {
          iVar1 = (*((((__position._M_current)->_M_t).
                      super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                      .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl)->
                    super_Displayable)._vptr_Displayable[1])();
          if (iVar1 == 0) {
            sVar2 = std::
                    set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                    ::count(&this->phi_dests,
                            &(((__position._M_current)->_M_t).
                              super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                              .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl)->dest);
            if (sVar2 == 0) goto LAB_001217e5;
            __position = std::
                         vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                         ::_M_erase((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                                     *)&p_Var3[3]._M_parent,__position);
          }
          else {
LAB_001217e5:
            __position._M_current = __position._M_current + 1;
          }
        } while ((_Base_ptr)__position._M_current != p_Var3[3]._M_left);
      }
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var4);
  }
  return;
}

Assistant:

void roll_phi() {
    for (auto& blkpair : func.basic_blks) {
      for (auto iter = blkpair.second.inst.begin();
           iter != blkpair.second.inst.end();) {
        if (iter->get()->inst_kind() == mir::inst::InstKind::Assign &&
            phi_dests.count(iter->get()->dest)) {
          iter = blkpair.second.inst.erase(iter);
        } else {
          iter++;
        }
      }
    }
  }